

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

void * mz_zip_extract_archive_file_to_heap_v2
                 (char *pZip_filename,char *pArchive_name,char *pComment,size_t *pSize,mz_uint flags
                 ,mz_zip_error *pErr)

{
  mz_bool mVar1;
  int iVar2;
  void *pvVar3;
  mz_uint32 file_index;
  mz_zip_archive zip_archive;
  mz_uint local_9c;
  mz_zip_archive local_98;
  
  if (pSize != (size_t *)0x0) {
    *pSize = 0;
  }
  if (pZip_filename == (char *)0x0 || pArchive_name == (char *)0x0) {
    local_98.m_last_error = MZ_ZIP_INVALID_PARAMETER;
    pvVar3 = (void *)0x0;
    if (pErr == (mz_zip_error *)0x0) {
      return (void *)0x0;
    }
  }
  else {
    local_98.m_pIO_opaque = (void *)0x0;
    local_98.m_pState = (mz_zip_internal_state *)0x0;
    local_98.m_pWrite = (mz_file_write_func)0x0;
    local_98.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    local_98.m_pAlloc_opaque = (void *)0x0;
    local_98.m_pRead = (mz_file_read_func)0x0;
    local_98.m_pFree = (mz_free_func)0x0;
    local_98.m_pRealloc = (mz_realloc_func)0x0;
    local_98.m_file_offset_alignment = 0;
    local_98.m_pAlloc = (mz_alloc_func)0x0;
    local_98.m_total_files = 0;
    local_98.m_zip_mode = MZ_ZIP_MODE_INVALID;
    local_98.m_zip_type = MZ_ZIP_TYPE_INVALID;
    local_98.m_last_error = MZ_ZIP_NO_ERROR;
    local_98.m_archive_size = 0;
    local_98.m_central_directory_file_ofs = 0;
    mVar1 = mz_zip_reader_init_file_v2(&local_98,pZip_filename,flags | 0x800,0,0);
    if (mVar1 == 0) {
      if (pErr == (mz_zip_error *)0x0) {
        return (void *)0x0;
      }
      pvVar3 = (void *)0x0;
    }
    else {
      iVar2 = mz_zip_reader_locate_file_v2(&local_98,pArchive_name,pComment,flags,&local_9c);
      if (iVar2 == 0) {
        pvVar3 = (void *)0x0;
      }
      else {
        pvVar3 = mz_zip_reader_extract_to_heap(&local_98,local_9c,pSize,flags);
      }
      mz_zip_reader_end_internal(&local_98,(uint)(pvVar3 != (void *)0x0));
      if (pErr == (mz_zip_error *)0x0) {
        return pvVar3;
      }
    }
  }
  *pErr = local_98.m_last_error;
  return pvVar3;
}

Assistant:

void *mz_zip_extract_archive_file_to_heap_v2(const char *pZip_filename, const char *pArchive_name, const char *pComment, size_t *pSize, mz_uint flags, mz_zip_error *pErr)
{
    mz_uint32 file_index;
    mz_zip_archive zip_archive;
    void *p = NULL;

    if (pSize)
        *pSize = 0;

    if ((!pZip_filename) || (!pArchive_name))
    {
        if (pErr)
            *pErr = MZ_ZIP_INVALID_PARAMETER;

        return NULL;
    }

    mz_zip_zero_struct(&zip_archive);
    if (!mz_zip_reader_init_file_v2(&zip_archive, pZip_filename, flags | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY, 0, 0))
    {
        if (pErr)
            *pErr = zip_archive.m_last_error;

        return NULL;
    }

    if (mz_zip_reader_locate_file_v2(&zip_archive, pArchive_name, pComment, flags, &file_index))
    {
        p = mz_zip_reader_extract_to_heap(&zip_archive, file_index, pSize, flags);
    }

    mz_zip_reader_end_internal(&zip_archive, p != NULL);

    if (pErr)
        *pErr = zip_archive.m_last_error;

    return p;
}